

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::json_abi_v3_11_3::detail::
iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
::iteration_proxy_value
          (iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           *this,iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *it,size_t array_index_)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  difference_type dVar7;
  
  uVar1 = *(undefined4 *)&it->m_object;
  uVar2 = *(undefined4 *)((long)&it->m_object + 4);
  uVar3 = *(undefined4 *)&(it->m_it).object_iterator._M_current;
  uVar4 = *(undefined4 *)((long)&(it->m_it).object_iterator._M_current + 4);
  uVar5 = *(undefined4 *)((long)&(it->m_it).array_iterator._M_current + 4);
  dVar7 = (it->m_it).primitive_iterator.m_it;
  uVar6 = *(undefined4 *)((long)&(it->m_it).primitive_iterator.m_it + 4);
  *(undefined4 *)&(this->anchor).m_it.array_iterator._M_current =
       *(undefined4 *)&(it->m_it).array_iterator._M_current;
  *(undefined4 *)((long)&(this->anchor).m_it.array_iterator._M_current + 4) = uVar5;
  *(int *)&(this->anchor).m_it.primitive_iterator.m_it = (int)dVar7;
  *(undefined4 *)((long)&(this->anchor).m_it.primitive_iterator.m_it + 4) = uVar6;
  *(undefined4 *)&(this->anchor).m_object = uVar1;
  *(undefined4 *)((long)&(this->anchor).m_object + 4) = uVar2;
  *(undefined4 *)&(this->anchor).m_it.object_iterator._M_current = uVar3;
  *(undefined4 *)((long)&(this->anchor).m_it.object_iterator._M_current + 4) = uVar4;
  this->array_index = array_index_;
  this->array_index_last = 0;
  (this->array_index_str)._M_dataplus._M_p = (pointer)&(this->array_index_str).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->array_index_str,"0","");
  (this->empty_str)._M_dataplus._M_p = (pointer)&(this->empty_str).field_2;
  (this->empty_str)._M_string_length = 0;
  (this->empty_str).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit iteration_proxy_value(IteratorType it, std::size_t array_index_ = 0)
    noexcept(std::is_nothrow_move_constructible<IteratorType>::value
             && std::is_nothrow_default_constructible<string_type>::value)
        : anchor(std::move(it))
        , array_index(array_index_)
    {}